

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O3

symbol * evaluate_conditional_expression(dmr_C *C,expression *expr)

{
  ctype *pcVar1;
  byte bVar2;
  int iVar3;
  symbol *psVar4;
  symbol *rtype;
  global_symbols_t *pgVar5;
  expression *peVar6;
  symbol *psVar7;
  symbol *psVar8;
  char *pcVar9;
  ulong uVar10;
  symbol *psVar11;
  char cVar12;
  char cVar13;
  uint lclass;
  uint rclass;
  symbol *psVar14;
  anon_union_32_18_55d8ca1e_for_expression_5 *paVar15;
  ulong uVar16;
  symbol *psVar17;
  bool bVar18;
  
  psVar4 = evaluate_conditional(C,(expr->field_5).field_3.unop,0);
  if (psVar4 == (symbol *)0x0) {
    return (symbol *)0x0;
  }
  psVar4 = dmrC_evaluate_expression(C,(expr->field_5).field_10.cond_false);
  if (psVar4 == (symbol *)0x0) {
    return (symbol *)0x0;
  }
  psVar4 = degenerate(C,(expr->field_5).field_3.unop);
  rtype = degenerate(C,(expr->field_5).field_10.cond_false);
  peVar6 = (expr->field_5).field_6.right;
  if (peVar6 == (expression *)0x0) {
    paVar15 = &expr->field_5;
  }
  else {
    psVar4 = dmrC_evaluate_expression(C,peVar6);
    if (psVar4 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    paVar15 = (anon_union_32_18_55d8ca1e_for_expression_5 *)((long)&expr->field_5 + 8);
    psVar4 = degenerate(C,(paVar15->field_3).unop);
  }
  if ((0xff < *(ushort *)expr) &&
     (((*(ushort *)(expr->field_5).field_3.unop & *(ushort *)(paVar15->field_3).unop &
       *(ushort *)(expr->field_5).field_10.cond_false) >> 8 & 1) == 0)) {
    *(ushort *)expr = *(ushort *)expr & 0xff;
  }
  bVar2 = *(byte *)psVar4;
  if (bVar2 == 3) {
    psVar4 = *(symbol **)((long)&psVar4->field_14 + 0x38);
    bVar2 = *(byte *)psVar4;
  }
  if (bVar2 == 0xb) {
    psVar4 = dmrC_evaluate_expression(C,(psVar4->field_14).field_2.initializer);
    if (psVar4 == (symbol *)0x0) {
      psVar4 = &C->S->bad_ctype;
    }
    else if (*(char *)psVar4 == '\x03') {
      psVar4 = *(symbol **)((long)&psVar4->field_14 + 0x38);
    }
  }
  bVar2 = *(byte *)psVar4;
  if (bVar2 == 9) {
    psVar4 = *(symbol **)((long)&psVar4->field_14 + 0x38);
    bVar2 = *(byte *)psVar4;
  }
  if (bVar2 == 2) {
    psVar17 = (psVar4->field_14).field_2.ctype.base_type;
    if (psVar17 == &C->S->int_type) {
      lclass = 1;
    }
    else {
      if (psVar17 != &C->S->fp_type) goto LAB_0010d46b;
      lclass = 9;
    }
  }
  else {
LAB_0010d46b:
    lclass = classify_type::type_class[(uint)bVar2];
  }
  bVar2 = *(byte *)rtype;
  if (bVar2 == 3) {
    rtype = *(symbol **)((long)&rtype->field_14 + 0x38);
    bVar2 = *(byte *)rtype;
  }
  if (bVar2 == 0xb) {
    rtype = dmrC_evaluate_expression(C,(rtype->field_14).field_2.initializer);
    if (rtype == (symbol *)0x0) {
      rtype = &C->S->bad_ctype;
    }
    else if (*(char *)rtype == '\x03') {
      rtype = *(symbol **)((long)&rtype->field_14 + 0x38);
    }
  }
  bVar2 = *(byte *)rtype;
  if (bVar2 == 9) {
    rtype = *(symbol **)((long)&rtype->field_14 + 0x38);
    bVar2 = *(byte *)rtype;
  }
  if (bVar2 == 2) {
    psVar17 = (rtype->field_14).field_2.ctype.base_type;
    if (psVar17 == &C->S->int_type) {
      rclass = 1;
    }
    else {
      if (psVar17 != &C->S->fp_type) goto LAB_0010d517;
      rclass = 9;
    }
  }
  else {
LAB_0010d517:
    rclass = classify_type::type_class[(uint)bVar2];
  }
  if ((rclass & lclass & 1) != 0) {
    psVar4 = usual_conversions(C,0x3f,(paVar15->field_3).unop,(expr->field_5).field_10.cond_false,
                               lclass,rclass,psVar4,rtype);
    peVar6 = cast_to(C,(paVar15->field_3).unop,psVar4);
    (paVar15->field_3).unop = peVar6;
    peVar6 = cast_to(C,(expr->field_5).field_10.cond_false,psVar4);
    (expr->field_5).field_10.cond_false = peVar6;
    psVar17 = psVar4;
    goto LAB_0010d5e9;
  }
  psVar17 = psVar4;
  if (((rclass | lclass) & 0x10) == 0) {
    if (psVar4 == rtype) goto LAB_0010d5e9;
    pcVar9 = "different base types";
  }
  else {
    peVar6 = (paVar15->field_3).unop;
    pgVar5 = C->S;
    if (peVar6->ctype == &pgVar5->null_ctype) {
      cVar13 = '\x01';
    }
    else {
      cVar13 = '\0';
      if ((peVar6->field_0x1 & 1) != 0) {
        iVar3 = dmrC_is_zero_constant(C,peVar6);
        cVar13 = (iVar3 != 0) * '\x02';
        pgVar5 = C->S;
      }
    }
    cVar12 = '\x01';
    peVar6 = (expr->field_5).field_10.cond_false;
    if (peVar6->ctype == &pgVar5->null_ctype) {
LAB_0010d691:
      bVar18 = cVar12 != '\0';
      if ((cVar13 != '\0') && (cVar12 != '\0')) {
        peVar6 = cast_to(C,(paVar15->field_3).unop,&C->S->ptr_ctype);
        (paVar15->field_3).unop = peVar6;
        peVar6 = cast_to(C,(expr->field_5).field_10.cond_false,&C->S->ptr_ctype);
        (expr->field_5).field_10.cond_false = peVar6;
        psVar4 = &C->S->ptr_ctype;
        psVar17 = psVar4;
        goto LAB_0010d5e9;
      }
    }
    else {
      if ((peVar6->field_0x1 & 1) != 0) {
        iVar3 = dmrC_is_zero_constant(C,peVar6);
        cVar12 = (iVar3 != 0) * '\x02';
        goto LAB_0010d691;
      }
      bVar18 = false;
      cVar12 = '\0';
    }
    if (((rclass & 0x10) != 0) && (cVar13 != '\0')) {
      if ((cVar13 == '\x02') && (C->Wnon_pointer_null != 0)) {
        dmrC_warning(C,((paVar15->field_3).unop)->pos,"Using plain integer as NULL pointer");
      }
      peVar6 = cast_to(C,(paVar15->field_3).unop,rtype);
      (paVar15->field_3).unop = peVar6;
      psVar4 = rtype;
      psVar17 = rtype;
      goto LAB_0010d5e9;
    }
    if ((bVar18 & (byte)((lclass & 0x10) >> 4)) == 1) {
      if ((cVar12 == '\x02') && (C->Wnon_pointer_null != 0)) {
        dmrC_warning(C,((expr->field_5).field_10.cond_false)->pos,
                     "Using plain integer as NULL pointer");
      }
LAB_0010d89e:
      peVar6 = cast_to(C,(expr->field_5).field_10.cond_false,psVar4);
      (expr->field_5).field_10.cond_false = peVar6;
      psVar17 = psVar4;
      goto LAB_0010d5e9;
    }
    if ((rclass & lclass & 0x10) == 0) {
      pcVar9 = "different types";
    }
    else if (*(int *)((long)&psVar4->field_14 + 0x30) == *(int *)((long)&rtype->field_14 + 0x30)) {
      psVar7 = dmrC_examine_pointer_target(C->S,psVar4);
      psVar8 = dmrC_examine_pointer_target(C->S,rtype);
      psVar14 = (psVar4->field_14).field_2.ctype.base_type;
      uVar10 = (ulong)((uint)(psVar4->field_14).field_2.ctype.modifiers & 0x2030);
      if ((psVar14 != (symbol *)0x0) && (*(char *)psVar14 == '\x06')) {
        uVar10 = 0;
      }
      psVar14 = (rtype->field_14).field_2.ctype.base_type;
      uVar16 = (ulong)((uint)(rtype->field_14).field_2.ctype.modifiers & 0x2030);
      if ((psVar14 != (symbol *)0x0) && (*(char *)psVar14 == '\x06')) {
        uVar16 = 0;
      }
      uVar16 = uVar16 | uVar10;
      psVar11 = &C->S->void_ctype;
      psVar14 = psVar4;
      if (((psVar7 == psVar11) || (psVar14 = rtype, psVar8 == psVar11)) ||
         (pcVar9 = dmrC_type_difference
                             (C,&(psVar4->field_14).field_2.ctype,&(rtype->field_14).field_2.ctype,
                              uVar16,uVar16), psVar14 = psVar4, pcVar9 == (char *)0x0)) {
        psVar4 = psVar14;
        if (((uint)uVar16 & ~*(uint *)((long)&psVar14->field_14 + 0x18)) != 0) {
          psVar4 = dmrC_alloc_symbol(C->S,psVar14->pos,4);
          memcpy(psVar4,psVar14,0xe8);
          pcVar1 = &(psVar4->field_14).field_2.ctype;
          pcVar1->modifiers = pcVar1->modifiers | uVar16;
        }
        peVar6 = cast_to(C,(paVar15->field_3).unop,psVar4);
        (paVar15->field_3).unop = peVar6;
        goto LAB_0010d89e;
      }
    }
    else {
      pcVar9 = "different address spaces";
    }
  }
  dmrC_expression_error(C,expr,"incompatible types in conditional expression (%s)",pcVar9);
  iVar3 = dmrC_expr_truth_value(C,(expr->field_5).field_3.unop);
  if ((iVar3 != 1) && (psVar17 = rtype, iVar3 != 0)) {
    return (symbol *)0x0;
  }
  psVar4 = (symbol *)0x0;
LAB_0010d5e9:
  expr->ctype = psVar17;
  return psVar4;
}

Assistant:

static struct symbol *evaluate_conditional_expression(struct dmr_C *C, struct expression *expr)
{
	struct expression **truee;
	struct symbol *ctype, *ltype, *rtype, *lbase, *rbase;
	int lclass, rclass;
	const char * typediff;
	int qual;

	if (!evaluate_conditional(C, expr->conditional, 0))
		return NULL;
	if (!dmrC_evaluate_expression(C, expr->cond_false))
		return NULL;

	ctype = degenerate(C, expr->conditional);
	rtype = degenerate(C, expr->cond_false);

	truee = &expr->conditional;
	ltype = ctype;
	if (expr->cond_true) {
		if (!dmrC_evaluate_expression(C, expr->cond_true))
			return NULL;
		ltype = degenerate(C, expr->cond_true);
		truee = &expr->cond_true;
	}

	if (expr->flags) {
		int flags = expr->conditional->flags & Int_const_expr;
		flags &= (*truee)->flags & expr->cond_false->flags;
		if (!flags)
			expr->flags = 0;
	}

	lclass = classify_type(C, ltype, &ltype);
	rclass = classify_type(C, rtype, &rtype);
	if (lclass & rclass & TYPE_NUM) {
		ctype = usual_conversions(C, '?', *truee, expr->cond_false,
					  lclass, rclass, ltype, rtype);
		*truee = cast_to(C, *truee, ctype);
		expr->cond_false = cast_to(C, expr->cond_false, ctype);
		goto out;
	}

	if ((lclass | rclass) & TYPE_PTR) {
		int is_null1 = is_null_pointer_constant(C, *truee);
		int is_null2 = is_null_pointer_constant(C, expr->cond_false);

		if (is_null1 && is_null2) {
			*truee = cast_to(C, *truee, &C->S->ptr_ctype);
			expr->cond_false = cast_to(C, expr->cond_false, &C->S->ptr_ctype);
			ctype = &C->S->ptr_ctype;
			goto out;
		}
		if (is_null1 && (rclass & TYPE_PTR)) {
			if (is_null1 == 2)
				bad_null(C, *truee);
			*truee = cast_to(C, *truee, rtype);
			ctype = rtype;
			goto out;
		}
		if (is_null2 && (lclass & TYPE_PTR)) {
			if (is_null2 == 2)
				bad_null(C, expr->cond_false);
			expr->cond_false = cast_to(C, expr->cond_false, ltype);
			ctype = ltype;
			goto out;
		}
		if (!(lclass & rclass & TYPE_PTR)) {
			typediff = "different types";
			goto Err;
		}
		/* OK, it's pointer on pointer */
		if (ltype->ctype.as != rtype->ctype.as) {
			typediff = "different address spaces";
			goto Err;
		}

		/* need to be lazier here */
		lbase = dmrC_examine_pointer_target(C->S, ltype);
		rbase = dmrC_examine_pointer_target(C->S, rtype);
		qual = target_qualifiers(C, ltype) | target_qualifiers(C, rtype);

		if (lbase == &C->S->void_ctype) {
			/* XXX: pointers to function should warn here */
			ctype = ltype;
			goto Qual;

		}
		if (rbase == &C->S->void_ctype) {
			/* XXX: pointers to function should warn here */
			ctype = rtype;
			goto Qual;
		}
		/* XXX: that should be pointer to composite */
		ctype = ltype;
		typediff = dmrC_type_difference(C, &ltype->ctype, &rtype->ctype,
					   qual, qual);
		if (!typediff)
			goto Qual;
		goto Err;
	}

	/* void on void, struct on same struct, union on same union */
	if (ltype == rtype) {
		ctype = ltype;
		goto out;
	}
	typediff = "different base types";

Err:
	dmrC_expression_error(C, expr, "incompatible types in conditional expression (%s)", typediff);
	/*
	 * if the condition is constant, the type is in fact known
	 * so use it, as gcc & clang do.
	 */
	switch (dmrC_expr_truth_value(C, expr->conditional)) {
	case 1:	expr->ctype = ltype;
		break;
	case 0: expr->ctype = rtype;
		break;
	default:
		break;
	}
	return NULL;

out:
	expr->ctype = ctype;
	return ctype;

Qual:
	if (qual & ~ctype->ctype.modifiers) {
		struct symbol *sym = dmrC_alloc_symbol(C->S, ctype->pos, SYM_PTR);
		*sym = *ctype;
		sym->ctype.modifiers |= qual;
		ctype = sym;
	}
	*truee = cast_to(C, *truee, ctype);
	expr->cond_false = cast_to(C, expr->cond_false, ctype);
	goto out;
}